

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  size_t max_size;
  secp256k1_context *ctx;
  uint in_ESI;
  void *in_RDI;
  secp256k1_context *ret;
  size_t prealloc_size;
  void *base;
  void **in_stack_00000058;
  secp256k1_ecmult_context *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  void *local_10;
  secp256k1_context *local_8;
  
  max_size = secp256k1_context_preallocated_size(in_stack_ffffffffffffffcc);
  ctx = (secp256k1_context *)manual_alloc(&local_10,0xd0,in_RDI,max_size);
  (ctx->error_callback).fn = default_error_callback_fn;
  (ctx->error_callback).data = (void *)0x0;
  if ((in_ESI & 0xff) == 1) {
    secp256k1_ecmult_context_init((secp256k1_ecmult_context *)ctx);
    secp256k1_ecmult_gen_context_init(&ctx->ecmult_gen_ctx);
    if ((in_ESI & 0x200) != 0) {
      secp256k1_ecmult_gen_context_build
                ((secp256k1_ecmult_gen_context *)ctx,
                 (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    local_8 = ctx;
    if ((in_ESI & 0x100) != 0) {
      secp256k1_ecmult_context_build(in_stack_00000060,in_stack_00000058);
      local_8 = ctx;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)ctx,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_8 = (secp256k1_context *)0x0;
  }
  return local_8;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    VERIFY_CHECK(prealloc != NULL);
    prealloc_size = secp256k1_context_preallocated_size(flags);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->error_callback = default_error_callback;

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&ret->illegal_callback,
                                    "Invalid flags");
            return NULL;
    }

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }

    return (secp256k1_context*)ret;
}